

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_mem.c
# Opt level: O0

void empty_blocklist(amqp_pool_blocklist_t *x)

{
  int *in_RDI;
  int i;
  int local_c;
  
  if (*(long *)(in_RDI + 2) != 0) {
    for (local_c = 0; local_c < *in_RDI; local_c = local_c + 1) {
      free(*(void **)(*(long *)(in_RDI + 2) + (long)local_c * 8));
    }
    free(*(void **)(in_RDI + 2));
  }
  *in_RDI = 0;
  in_RDI[2] = 0;
  in_RDI[3] = 0;
  return;
}

Assistant:

static void empty_blocklist(amqp_pool_blocklist_t *x) {
  int i;

  if (x->blocklist != NULL) {
    for (i = 0; i < x->num_blocks; i++) {
      free(x->blocklist[i]);
    }
    free(x->blocklist);
  }
  x->num_blocks = 0;
  x->blocklist = NULL;
}